

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void gravity_well_explode(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *af)

{
  bool bVar1;
  bool bVar2;
  long in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  bool wasinroom;
  int dam;
  OBJ_DATA *well;
  CHAR_DATA *ch;
  CHAR_DATA *v_next;
  CHAR_DATA *victim;
  undefined1 in_stack_00001322;
  undefined1 in_stack_00001323;
  int in_stack_00001324;
  int in_stack_00001328;
  int in_stack_0000132c;
  CHAR_DATA *in_stack_00001330;
  CHAR_DATA *in_stack_00001338;
  int in_stack_00001358;
  int in_stack_00001360;
  char *in_stack_00001368;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ROOM_INDEX_DATA *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  CHAR_DATA *victim_00;
  CHAR_DATA *ch_00;
  CHAR_DATA *ch_01;
  CHAR_DATA *local_18;
  
  ch_00 = *(CHAR_DATA **)(in_RSI + 8);
  bVar1 = true;
  affect_strip_area((AREA_DATA_conflict *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  for (victim_00 = (CHAR_DATA *)object_list;
      (victim_00 != (CHAR_DATA *)0x0 &&
      (((*(short *)&victim_00->carrying != 0x26 || (victim_00->hunting == (CHAR_DATA *)0x0)) ||
       (victim_00->hunting != in_RDI)))); victim_00 = victim_00->next) {
  }
  if (victim_00 != (CHAR_DATA *)0x0) {
    send_to_char((char *)in_stack_ffffffffffffffc0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (victim_00->hunting->leader != (CHAR_DATA *)0x0) {
      act((char *)in_stack_ffffffffffffffc0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
          (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    extract_obj((OBJ_DATA *)victim_00);
    affect_strip_room(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    ch_01 = in_RDI->leader;
    while (local_18 = ch_01, local_18 != (CHAR_DATA *)0x0) {
      ch_01 = local_18->next_in_room;
      bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if ((bVar2) ||
         (bVar2 = is_safe_new(ch_00,victim_00,SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0)),
         !bVar2)) {
        in_stack_ffffffffffffffcc = dice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        if (ch_00 == local_18) {
          in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc / 2;
        }
        if (ch_00->in_room == (ROOM_INDEX_DATA *)0x0) {
          char_to_room(ch_01,(ROOM_INDEX_DATA *)ch_00);
          bVar1 = false;
        }
        in_stack_ffffffffffffffa8 = 0;
        in_stack_ffffffffffffffb0 = 0;
        damage_new(in_stack_00001338,in_stack_00001330,in_stack_0000132c,in_stack_00001328,
                   in_stack_00001324,(bool)in_stack_00001323,(bool)in_stack_00001322,
                   in_stack_00001358,in_stack_00001360,in_stack_00001368);
        if (!bVar1) {
          char_from_room(unaff_retaddr);
        }
      }
    }
  }
  return;
}

Assistant:

void gravity_well_explode(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *af)
{
	CHAR_DATA *victim, *v_next, *ch = af->owner;
	OBJ_DATA *well;
	int dam;
	bool wasinroom = true;

	affect_strip_area(room->area, gsn_gravity_well);

	for (well = object_list; well != nullptr; well = well->next)
	{
		if (well->item_type == ITEM_GRAVITYWELL && well->in_room && well->in_room == room)
			break;
	}

	if (!well)
		return;

	send_to_char("You lose control of your gravity well and it ruptures violently!\n\r", ch);

	if (well->in_room->people)
		act("The gravity well flares brightly and explodes, sending waves of force rippling outward!", well->in_room->people, 0, 0, TO_ALL);

	extract_obj(well);
	affect_strip_room(room, gsn_gravity_well);

	for (victim = room->people; victim != nullptr; victim = v_next)
	{
		v_next = victim->next_in_room;

		if (!is_npc(victim) && is_safe_new(ch, victim, false))
			continue;

		dam = dice(20, 20);

		if (ch == victim)
			dam /= 2;

		if (!ch->in_room)
		{
			char_to_room(ch, room);
			wasinroom = false;
		}

		damage_new(ch, victim, dam, af->type, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the violent explosion*");

		if (!wasinroom)
			char_from_room(ch);
	}
}